

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O2

void FM_KEYOFF_CSM(FM_CH *CH,int s)

{
  byte bVar1;
  int iVar2;
  
  if ((CH->SLOT[(uint)s].key == '\0') && (1 < CH->SLOT[(uint)s].state)) {
    CH->SLOT[(uint)s].state = '\x01';
    bVar1 = CH->SLOT[(uint)s].ssg;
    if ((bVar1 & 8) != 0) {
      iVar2 = CH->SLOT[(uint)s].volume;
      if ((bVar1 & 4) != CH->SLOT[(uint)s].ssgn) {
        iVar2 = 0x200 - iVar2;
        CH->SLOT[(uint)s].volume = iVar2;
      }
      if (0x1ff < iVar2) {
        CH->SLOT[(uint)s].volume = 0x3ff;
        CH->SLOT[(uint)s].state = '\0';
        iVar2 = 0x3ff;
      }
      CH->SLOT[(uint)s].vol_out = iVar2 + CH->SLOT[(uint)s].tl;
      return;
    }
  }
  return;
}

Assistant:

INLINE void FM_KEYOFF_CSM(FM_CH *CH , int s )
{
	FM_SLOT *SLOT = &CH->SLOT[s];
	if (!SLOT->key)
	{
		if (SLOT->state>EG_REL)
		{
			SLOT->state = EG_REL; /* phase -> Release */

			/* SSG-EG specific update */
			if (SLOT->ssg&0x08)
			{
				/* convert EG attenuation level */
				if (SLOT->ssgn ^ (SLOT->ssg&0x04))
					SLOT->volume = (0x200 - SLOT->volume);

				/* force EG attenuation level */
				if (SLOT->volume >= 0x200)
				{
					SLOT->volume = MAX_ATT_INDEX;
					SLOT->state  = EG_OFF;
				}

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
			}
		}
	}
}